

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_uu.c
# Opt level: O1

int uudecode_filter_close(archive_read_filter *self)

{
  void *__ptr;
  
  __ptr = self->data;
  free(*(void **)((long)__ptr + 8));
  free(*(void **)((long)__ptr + 0x20));
  free(*(void **)((long)__ptr + 0x38));
  free(__ptr);
  return 0;
}

Assistant:

static int
uudecode_filter_close(struct archive_read_filter *self)
{
	struct uudecode *uudecode;

	uudecode = (struct uudecode *)self->data;
	free(uudecode->in_buff);
	free(uudecode->out_buff);
	free(uudecode->name);
	free(uudecode);

	return (ARCHIVE_OK);
}